

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMakeLocalFileName>::emplace<QMakeLocalFileName>
          (QGenericArrayOps<QMakeLocalFileName> *this,qsizetype i,QMakeLocalFileName *args)

{
  qsizetype *pqVar1;
  QMakeLocalFileName **ppQVar2;
  Data *pDVar3;
  QMakeLocalFileName *pQVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  QArrayData *pQVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  Data *pDVar11;
  longlong __old_val_3;
  longlong __old_val;
  QTypedArrayData<char16_t> *__old_val_1;
  char16_t *__old_val_2;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter local_b8;
  QMakeLocalFileName local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QMakeLocalFileName>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_001876bd:
    pQVar5 = &((args->real_name).d.d)->super_QArrayData;
    (args->real_name).d.d = (Data *)0x0;
    pcVar6 = (args->real_name).d.ptr;
    (args->real_name).d.ptr = (char16_t *)0x0;
    qVar7 = (args->real_name).d.size;
    (args->real_name).d.size = 0;
    pQVar8 = &((args->local_name).d.d)->super_QArrayData;
    (args->local_name).d.d = (Data *)0x0;
    pcVar9 = (args->local_name).d.ptr;
    (args->local_name).d.ptr = (char16_t *)0x0;
    qVar10 = (args->local_name).d.size;
    (args->local_name).d.size = 0;
    bVar12 = (this->super_QArrayDataPointer<QMakeLocalFileName>).size != 0;
    local_68.real_name.d.d = (Data *)pQVar5;
    local_68.real_name.d.ptr = pcVar6;
    local_68.real_name.d.size = qVar7;
    local_68.local_name.d.d = (Data *)pQVar8;
    local_68.local_name.d.ptr = pcVar9;
    local_68.local_name.d.size = qVar10;
    QArrayDataPointer<QMakeLocalFileName>::detachAndGrow
              (&this->super_QArrayDataPointer<QMakeLocalFileName>,(uint)(i == 0 && bVar12),1,
               (QMakeLocalFileName **)0x0,(QArrayDataPointer<QMakeLocalFileName> *)0x0);
    if (i == 0 && bVar12) {
      pQVar4 = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      local_68.real_name.d.d = (Data *)0x0;
      pQVar4[-1].real_name.d.d = (Data *)pQVar5;
      local_68.real_name.d.ptr = (char16_t *)0x0;
      pQVar4[-1].real_name.d.ptr = pcVar6;
      local_68.real_name.d.size = 0;
      pQVar4[-1].real_name.d.size = qVar7;
      local_68.local_name.d.d = (Data *)0x0;
      pQVar4[-1].local_name.d.d = (Data *)pQVar8;
      local_68.local_name.d.ptr = (char16_t *)0x0;
      pQVar4[-1].local_name.d.ptr = pcVar9;
      local_68.local_name.d.size = 0;
      pQVar4[-1].local_name.d.size = qVar10;
      (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr = pQVar4 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_b8.sourceCopyConstruct = 0;
      local_b8.nSource = 0;
      local_b8.move = 0;
      local_b8.sourceCopyAssign = 0;
      local_b8.end = (QMakeLocalFileName *)0x0;
      local_b8.last = (QMakeLocalFileName *)0x0;
      local_b8.where = (QMakeLocalFileName *)0x0;
      local_b8.begin = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      local_b8.size = (this->super_QArrayDataPointer<QMakeLocalFileName>).size;
      local_b8.data = &this->super_QArrayDataPointer<QMakeLocalFileName>;
      Inserter::insertOne(&local_b8,i,&local_68);
      (local_b8.data)->ptr = local_b8.begin;
      (local_b8.data)->size = local_b8.size;
      if (&(local_68.local_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_68.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_68.local_name.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_68.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_68.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_68.real_name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QArrayDataPointer<QMakeLocalFileName>).size == i) &&
       (pQVar4 = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar11 = (args->real_name).d.d;
      (args->real_name).d.d = (Data *)0x0;
      pQVar4[i].real_name.d.d = pDVar11;
      pcVar6 = (args->real_name).d.ptr;
      (args->real_name).d.ptr = (char16_t *)0x0;
      pQVar4[i].real_name.d.ptr = pcVar6;
      qVar7 = (args->real_name).d.size;
      (args->real_name).d.size = 0;
      pQVar4[i].real_name.d.size = qVar7;
      pDVar11 = (args->local_name).d.d;
      (args->local_name).d.d = (Data *)0x0;
      pQVar4[i].local_name.d.d = pDVar11;
      pcVar6 = (args->local_name).d.ptr;
      (args->local_name).d.ptr = (char16_t *)0x0;
      pQVar4[i].local_name.d.ptr = pcVar6;
      qVar7 = (args->local_name).d.size;
      (args->local_name).d.size = 0;
      pQVar4[i].local_name.d.size = qVar7;
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr,
         (QMakeLocalFileName *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_001876bd;
      pDVar11 = (args->real_name).d.d;
      (args->real_name).d.d = (Data *)0x0;
      pQVar4[-1].real_name.d.d = pDVar11;
      pcVar6 = (args->real_name).d.ptr;
      (args->real_name).d.ptr = (char16_t *)0x0;
      pQVar4[-1].real_name.d.ptr = pcVar6;
      qVar7 = (args->real_name).d.size;
      (args->real_name).d.size = 0;
      pQVar4[-1].real_name.d.size = qVar7;
      pDVar11 = (args->local_name).d.d;
      (args->local_name).d.d = (Data *)0x0;
      pQVar4[-1].local_name.d.d = pDVar11;
      pcVar6 = (args->local_name).d.ptr;
      (args->local_name).d.ptr = (char16_t *)0x0;
      pQVar4[-1].local_name.d.ptr = pcVar6;
      qVar7 = (args->local_name).d.size;
      (args->local_name).d.size = 0;
      pQVar4[-1].local_name.d.size = qVar7;
      ppQVar2 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }